

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzplane.cpp
# Opt level: O3

int __thiscall
TPZPlane::SetPlane(TPZPlane *this,TPZVec<double> *p1,TPZVec<double> *p2,TPZVec<double> *p3)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  double *pdVar13;
  double dVar14;
  REAL RVar15;
  REAL RVar16;
  REAL RVar17;
  TPZVec<double> aux;
  TPZVec<double> desloc2;
  TPZVec<double> desloc1;
  REAL matrix [3] [3];
  REAL sol [3];
  int ordem [3];
  REAL matrix2 [3] [3];
  TPZVec<double> local_158;
  TPZVec<double> local_138;
  TPZVec<double> local_118;
  double local_f8 [10];
  double local_a8 [4];
  int local_84 [3];
  REAL local_78 [3];
  double adStack_60 [6];
  
  TPZVec<double>::TPZVec(&local_118,3);
  TPZVec<double>::TPZVec(&local_138,3);
  TPZVec<double>::TPZVec(&local_158,3);
  pdVar2 = p1->fStore;
  pdVar13 = p2->fStore;
  pdVar3 = p3->fStore;
  lVar12 = 0;
  do {
    local_118.fStore[lVar12] = pdVar2[lVar12] - pdVar13[lVar12];
    local_138.fStore[lVar12] = pdVar13[lVar12] - pdVar3[lVar12];
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  TPZNumeric::ProdVetorial<double>(&local_118,&local_138,&local_158);
  pdVar2 = local_158.fStore;
  dVar14 = 0.0;
  lVar12 = 0;
  do {
    dVar14 = dVar14 + *(double *)((long)local_158.fStore + lVar12) *
                      *(double *)((long)local_158.fStore + lVar12);
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0x18);
  if (dVar14 <= 1e-10) {
    iVar6 = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "TPZPlane::SetPlane - Error: Colinear points can\'t define a single plane\n",0x48);
  }
  else {
    pdVar3 = p1->fStore;
    pdVar4 = p2->fStore;
    pdVar5 = p3->fStore;
    lVar12 = 1;
    pdVar13 = local_f8 + 2;
    do {
      local_f8[0] = pdVar3[lVar12 + -1];
      lVar7 = lVar12;
      if (lVar12 == 3) {
        lVar7 = 0;
      }
      local_f8[1] = pdVar3[lVar7];
      local_f8[3] = pdVar4[lVar12 + -1];
      local_f8[4] = pdVar4[lVar7];
      local_f8[6] = pdVar5[lVar12 + -1];
      local_f8[7] = pdVar5[lVar7];
      *pdVar13 = 1.0;
      RVar15 = MatrixDet((REAL (*) [3])local_f8);
      pdVar2[lVar12 + -1] = RVar15;
      lVar12 = lVar12 + 1;
      pdVar13 = pdVar13 + 3;
    } while (lVar12 != 4);
    TPZNumeric::SortArray3<double>(&local_158,local_84);
    iVar10 = ((local_84[0] + 1) / 3) * -3 + local_84[0] + 1;
    iVar11 = ((local_84[0] + 2) / 3) * -3 + local_84[0] + 2;
    iVar6 = local_84[0] % 3;
    pdVar2 = p1->fStore;
    local_f8[0] = pdVar2[iVar6];
    local_f8[1] = pdVar2[iVar10];
    pdVar13 = p2->fStore;
    local_f8[3] = pdVar13[iVar6];
    local_f8[4] = pdVar13[iVar10];
    local_f8[6] = p3->fStore[iVar6];
    local_f8[7] = p3->fStore[iVar10];
    RVar15 = pdVar2[iVar11];
    dVar14 = pdVar13[iVar11];
    RVar16 = MatrixDet((REAL (*) [3])local_f8);
    lVar12 = 0;
    do {
      local_78[lVar12] = -RVar15;
      adStack_60[lVar12] = -dVar14;
      adStack_60[lVar12 + 3] = -dVar14;
      lVar7 = lVar12 + 1;
      lVar8 = 0;
      if (lVar12 != 2) {
        lVar8 = lVar7;
      }
      dVar1 = local_f8[lVar8 + 3];
      local_78[lVar8] = local_f8[lVar8];
      adStack_60[lVar8] = dVar1;
      adStack_60[lVar8 + 3] = local_f8[lVar8 + 6];
      uVar9 = (ulong)((int)lVar12 - 1);
      if (lVar12 == 0) {
        uVar9 = 2;
      }
      dVar1 = local_f8[uVar9 + 3];
      local_78[uVar9] = local_f8[uVar9];
      adStack_60[uVar9] = dVar1;
      adStack_60[uVar9 + 3] = local_f8[uVar9 + 6];
      RVar17 = MatrixDet(&local_78);
      local_a8[lVar12] = RVar17 / RVar16;
      lVar12 = lVar7;
    } while (lVar7 != 3);
    pdVar2 = (this->fCoef).fStore;
    pdVar2[iVar6] = local_a8[0];
    pdVar2[iVar10] = local_a8[1];
    pdVar2[iVar11] = 1.0;
    pdVar2[3] = local_a8[2];
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    iVar6 = 1;
    std::ostream::flush();
  }
  local_158._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  if (local_158.fStore != (double *)0x0) {
    operator_delete__(local_158.fStore);
  }
  local_138._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  if (local_138.fStore != (double *)0x0) {
    operator_delete__(local_138.fStore);
  }
  local_118._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  if (local_118.fStore != (double *)0x0) {
    operator_delete__(local_118.fStore);
  }
  return iVar6;
}

Assistant:

int TPZPlane::SetPlane(const TPZVec<REAL> &p1, const TPZVec<REAL> &p2,const TPZVec<REAL> &p3){
	REAL matrix[3][3];
	TPZVec<REAL> desloc1(3), desloc2(3);
	TPZVec<REAL> aux(3);
	int i ;
	
	for(i=0; i<3;i++){
		desloc1[i] = p1[i]- p2[i];
		desloc2[i] = p2[i]-p3[i];
	}  
	TPZNumeric::ProdVetorial(desloc1, desloc2, aux);
	REAL norm = inner_product(&aux[0], &aux[3], &aux[0], REAL(0.0));
	if(norm <= 1e-10){
		cerr << "TPZPlane::SetPlane - Error: Colinear points can't define a single plane\n";
		return 0;
	}
	else{
		for(i=0; i<3;i++){
			matrix[0][0]=p1[i%3];
			matrix[0][1]=p1[(i+1)%3];
			matrix[1][0]=p2[i%3];
			matrix[1][1]=p2[(i+1)%3];
			matrix[2][0]=p3[i%3];
			matrix[2][1]=p3[(i+1)%3];
			matrix[i][2]=1.0;
			MatrixDet(matrix, aux[i]);
		}
		
		int ordem[3];
		REAL vect[3];
		TPZNumeric::SortArray3(aux,ordem);
		i=ordem[0];
		
		matrix[0][0]=p1[i%3];
		matrix[0][1]=p1[(i+1)%3];
		matrix[1][0]=p2[i%3];
		matrix[1][1]=p2[(i+1)%3];
		matrix[2][0]=p3[i%3];
		matrix[2][1]=p3[(i+1)%3];
		vect[0]=-p1[(i+2)%3];
		vect[1]=-p2[(i+2)%3];
		vect[2]=-p2[(i+2)%3];
		
		REAL matrix2[3][3];
		REAL sol[3];
		
		for(i=0; i<3;i++){
			matrix2[0][i%3]=vect[0];
			matrix2[1][i%3]=vect[1];
			matrix2[2][i%3]=vect[2];
			matrix2[0][(i+1)%3]=matrix[0][(i+1)%3];
			matrix2[1][(i+1)%3]=matrix[1][(i+1)%3];
			matrix2[2][(i+1)%3]=matrix[2][(i+1)%3];
			matrix2[0][(i+2)%3]=matrix[0][(i+2)%3];
			matrix2[1][(i+2)%3]=matrix[1][(i+2)%3];
			matrix2[2][(i+2)%3]=matrix[2][(i+2)%3];
			
			sol[i]=MatrixDet(matrix2)/MatrixDet(matrix);
		}
		fCoef[(ordem[0])%3]=sol[0];
		fCoef[(ordem[0]+1)%3]=sol[1];
		fCoef[(ordem[0]+2)%3]= 1.0;
		fCoef[3]=sol[2];
	}
	cout <<endl;
	return 1;	
}